

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scala_scl.cpp
# Opt level: O3

scale * scala::read_scl(scale *__return_storage_ptr__,ifstream *input_file)

{
  int iVar1;
  double dVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  char cVar4;
  bool bVar5;
  pointer psVar6;
  int *piVar7;
  undefined8 uVar8;
  long lVar9;
  int iVar10;
  iterator __position;
  string entry;
  string buffer;
  smatch trimmed;
  smatch match;
  regex COMMENT_REGEX;
  undefined1 local_138 [40];
  vector<scala::degree,std::allocator<scala::degree>> *local_110;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  long local_100;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  long local_d8;
  char local_d0 [16];
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0 [4];
  long local_a0;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_98;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_78;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  local_e0._M_current = local_d0;
  local_d8 = 0;
  local_d0[0] = '\0';
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_begin._M_current = (char *)0x0;
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_begin._M_current = (char *)0x0;
  local_98.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scale::scale(__return_storage_ptr__);
  local_110 = (vector<scala::degree,std::allocator<scala::degree>> *)__return_storage_ptr__;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_50,"[ \t]*!.*",0x10);
  lVar9 = *(long *)(*(long *)input_file + -0x18);
  if (((byte)input_file[lVar9 + 0x20] & 5) == 0) {
    iVar10 = 0;
    do {
      cVar4 = std::ios::widen((char)lVar9 + (char)input_file);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)input_file,(string *)&local_e0,cVar4);
      local_138._16_8_ = (element_type *)0x0;
      local_138._24_8_ = (char *)0x0;
      local_138._0_8_ =
           (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      local_138._8_8_ = (pointer)0x0;
      bVar5 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (local_e0,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )(local_e0._M_current + local_d8),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_138,&local_50,0);
      if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_138._0_8_ !=
          (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        operator_delete((void *)local_138._0_8_);
      }
      if (!bVar5) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_108,"[ \t]*",0x10)
        ;
        local_138._16_8_ = (element_type *)0x0;
        local_138._24_8_ = (char *)0x0;
        local_138._0_8_ =
             (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
        local_138._8_8_ = (pointer)0x0;
        bVar5 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (local_e0,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     )(local_e0._M_current + local_d8),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_138,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_108,0);
        if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_138._0_8_ !=
            (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          operator_delete((void *)local_138._0_8_);
        }
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_108);
        if (bVar5) {
          iVar10 = iVar10 + 1;
        }
        else {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_138,
                     "([ \t]*)([^ \t]*)(.*)",0x10);
          std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                    (local_e0,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(local_e0._M_current + local_d8),&local_98,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_138,0);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_138);
          lVar9 = (long)local_98.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar9 == 0) || (0xfffffffffffffffc < (lVar9 >> 3) * -0x5555555555555555 - 6U)) {
            psVar6 = (pointer)((long)local_98.
                                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x48);
          }
          else {
            psVar6 = local_98.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 2;
          }
          if (psVar6->matched == true) {
            local_108._M_current = (char *)&local_f8;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_108,
                       (psVar6->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (psVar6->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_108._M_current = (char *)&local_f8;
            local_100 = 0;
            local_f8.
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .first._M_current._0_1_ = 0;
          }
          _Var3._M_current = local_108._M_current;
          if (iVar10 == 0) {
            iVar10 = 1;
            goto LAB_00111eb6;
          }
          if (iVar10 == 1) {
            piVar7 = __errno_location();
            iVar10 = *piVar7;
            *piVar7 = 0;
            strtoul(_Var3._M_current,(char **)local_138,10);
            if ((char *)local_138._0_8_ == _Var3._M_current) {
              std::__throw_invalid_argument("stoul");
LAB_00111f47:
              std::__throw_invalid_argument("stod");
LAB_00111f53:
              std::__throw_out_of_range("stoul");
LAB_00111f5f:
              std::__throw_out_of_range("stoi");
LAB_00111f6b:
              std::__throw_invalid_argument("stoi");
LAB_00111f77:
              std::__throw_out_of_range("stoi");
LAB_00111f83:
              std::__throw_invalid_argument("stoi");
LAB_00111f8f:
              std::__throw_out_of_range("stod");
LAB_00111f9b:
              std::__throw_out_of_range("stoi");
LAB_00111fa7:
              uVar8 = std::__throw_invalid_argument("stoi");
              if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_108._M_current != &local_f8) {
                operator_delete(local_108._M_current);
              }
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                        (&local_50);
              scale::~scale((scale *)local_110);
              if (local_98.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_98.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_78.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_78.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_e0._M_current != local_d0) {
                operator_delete(local_e0._M_current);
              }
              _Unwind_Resume(uVar8);
            }
            if (*piVar7 == 0) {
              *piVar7 = iVar10;
            }
            else if (*piVar7 == 0x22) goto LAB_00111f53;
            iVar10 = 2;
            __return_storage_ptr__ = (scale *)local_110;
          }
          else {
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                      ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c0,".*[.]+.*",
                       0x10);
            local_138._16_8_ = (element_type *)0x0;
            local_138._24_8_ = (char *)0x0;
            local_138._0_8_ =
                 (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
            local_138._8_8_ = (pointer)0x0;
            bVar5 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              (local_108,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(local_108._M_current + local_100),
                               (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)local_138,
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c0,0);
            if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138._0_8_ !=
                (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
              operator_delete((void *)local_138._0_8_);
            }
            std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                      ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c0);
            _Var3._M_current = local_108._M_current;
            if (bVar5) {
              piVar7 = __errno_location();
              iVar1 = *piVar7;
              *piVar7 = 0;
              dVar2 = strtod(_Var3._M_current,(char **)local_138);
              __return_storage_ptr__ = (scale *)local_110;
              if ((char *)local_138._0_8_ == _Var3._M_current) goto LAB_00111f47;
              if (*piVar7 == 0) {
                *piVar7 = iVar1;
              }
              else if (*piVar7 == 0x22) goto LAB_00111f8f;
              local_138._0_8_ = pow(1.0594630943592953,dVar2 / 100.0);
              __position._M_current = *(degree **)((long)__return_storage_ptr__ + 8);
              if (__position._M_current == *(degree **)((long)__return_storage_ptr__ + 0x10)) {
                std::vector<scala::degree,std::allocator<scala::degree>>::
                _M_realloc_insert<scala::degree_const&>
                          ((vector<scala::degree,std::allocator<scala::degree>> *)
                           __return_storage_ptr__,__position,(degree *)local_138);
                goto LAB_00111eb6;
              }
            }
            else {
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c0,
                         ".*[/]{1}.*",0x10);
              local_138._16_8_ = (element_type *)0x0;
              local_138._24_8_ = (char *)0x0;
              local_138._0_8_ =
                   (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0;
              local_138._8_8_ = (pointer)0x0;
              bVar5 = std::__detail::
                      __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                (local_108,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(local_108._M_current + local_100),
                                 (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)local_138,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c0,0)
              ;
              if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138._0_8_ !=
                  (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0) {
                operator_delete((void *)local_138._0_8_);
              }
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c0);
              if (bVar5) {
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                          ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_138,
                           "(.*)/(.*)",0x10);
                std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          (local_108,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_108._M_current + local_100),&local_78,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_138,0);
                std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                          ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_138);
                std::__cxx11::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::str((string_type *)local_138,&local_78,1);
                uVar8 = local_138._0_8_;
                piVar7 = __errno_location();
                iVar1 = *piVar7;
                *piVar7 = 0;
                lVar9 = strtol((char *)uVar8,(char **)local_c0,10);
                if (local_c0[0] !=
                    (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)uVar8) {
                  if (((int)lVar9 == lVar9) && (*piVar7 != 0x22)) {
                    if (*piVar7 == 0) {
                      *piVar7 = iVar1;
                    }
                    local_a0 = lVar9;
                    if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_138._0_8_ !=
                        (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_138 + 0x10)) {
                      operator_delete((void *)local_138._0_8_);
                    }
                    std::__cxx11::
                    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::str((string_type *)local_138,&local_78,2);
                    uVar8 = local_138._0_8_;
                    local_f8._20_4_ = *piVar7;
                    *piVar7 = 0;
                    lVar9 = strtol((char *)local_138._0_8_,(char **)local_c0,10);
                    __return_storage_ptr__ = (scale *)local_110;
                    if (local_c0[0] !=
                        (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)uVar8) {
                      if ((0xfffffffeffffffff < lVar9 - 0x80000000U) && (*piVar7 != 0x22)) {
                        if (*piVar7 == 0) {
                          *piVar7 = local_f8._20_4_;
                        }
                        if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_138._0_8_ !=
                            (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_138 + 0x10)) {
                          operator_delete((void *)local_138._0_8_);
                        }
                        local_138._0_8_ = (double)(int)local_a0 / (double)(int)lVar9;
                        __position._M_current = *(degree **)((long)__return_storage_ptr__ + 8);
                        if (__position._M_current !=
                            *(degree **)((long)__return_storage_ptr__ + 0x10)) goto LAB_00111dac;
                        std::vector<scala::degree,std::allocator<scala::degree>>::
                        _M_realloc_insert<scala::degree_const&>
                                  ((vector<scala::degree,std::allocator<scala::degree>> *)
                                   __return_storage_ptr__,__position,(degree *)local_138);
                        goto LAB_00111eb6;
                      }
                      goto LAB_00111f5f;
                    }
                    goto LAB_00111f6b;
                  }
                  goto LAB_00111f77;
                }
                goto LAB_00111f83;
              }
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c0,"[0-9]*",
                         0x10);
              local_138._16_8_ = (element_type *)0x0;
              local_138._24_8_ = (char *)0x0;
              local_138._0_8_ =
                   (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0;
              local_138._8_8_ = (pointer)0x0;
              bVar5 = std::__detail::
                      __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                                (local_108,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(local_108._M_current + local_100),
                                 (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)local_138,
                                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c0,0)
              ;
              __return_storage_ptr__ = (scale *)local_110;
              if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_138._0_8_ !=
                  (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0) {
                operator_delete((void *)local_138._0_8_);
              }
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                        ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_c0);
              _Var3._M_current = local_108._M_current;
              if (!bVar5) goto LAB_00111eb6;
              piVar7 = __errno_location();
              iVar1 = *piVar7;
              *piVar7 = 0;
              lVar9 = strtol(_Var3._M_current,(char **)local_138,10);
              __return_storage_ptr__ = (scale *)local_110;
              if ((char *)local_138._0_8_ == _Var3._M_current) goto LAB_00111fa7;
              if (((int)lVar9 != lVar9) || (*piVar7 == 0x22)) goto LAB_00111f9b;
              if (*piVar7 == 0) {
                *piVar7 = iVar1;
              }
              local_138._0_8_ = (undefined8)(int)lVar9;
              __position._M_current = *(degree **)(local_110 + 8);
              if (__position._M_current == *(degree **)(local_110 + 0x10)) {
                std::vector<scala::degree,std::allocator<scala::degree>>::
                _M_realloc_insert<scala::degree_const&>(local_110,__position,(degree *)local_138);
                goto LAB_00111eb6;
              }
            }
LAB_00111dac:
            (__position._M_current)->ratio = (double)local_138._0_8_;
            *(degree **)((long)__return_storage_ptr__ + 8) = __position._M_current + 1;
          }
LAB_00111eb6:
          if ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108._M_current != &local_f8) {
            operator_delete(local_108._M_current);
          }
        }
      }
      lVar9 = *(long *)(*(long *)input_file + -0x18);
    } while (((byte)input_file[lVar9 + 0x20] & 5) == 0);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
  if (local_98.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0._M_current != local_d0) {
    operator_delete(local_e0._M_current);
  }
  return (scale *)(vector<scala::degree,std::allocator<scala::degree>> *)__return_storage_ptr__;
}

Assistant:

scale read_scl(std::ifstream& input_file){ 
        /* 
        C++ Code to parse the Scala scale file, as documented here:

            http://www.huygens-fokker.org/scala/scl_format.html

        A couple of extensions:

        - Allow white-space before the comment character.  Spec is a little ambiguous.
        - Allow blank lines. In the standard only the scale name is mentioned as potentially blank.
        */
        
        int non_commnets_processed = 0;
        unsigned long entries = 0;
        int numerator, denominator;
        std::string buffer;
        std::smatch match, trimmed;
        scale scala_scale;
        bool description_parsed = false ;

#ifdef SCALA_STRICT
        std::regex COMMENT_REGEX = std::regex("^!.*");
#else
        std::regex COMMENT_REGEX = std::regex("[ \t]*!.*");
#endif

        while (input_file) {
            getline(input_file, buffer);
            if (std::regex_match (buffer, COMMENT_REGEX)) {
                // We're defining a comment as the first non-whitespace character being a "!".
            } else if (std::regex_match (buffer, std::regex("[ \t]*") )) {
                // Blank line. Discard. This may be an extension of the format.
#ifdef SCALA_STRICT
                if (description_parsed) {
                    // If we're at a blank line which is not the description, assume it's 
                    // a final linefeed at the end of the file.
                    break;
                }
#endif
                if (non_commnets_processed == 0){
                    description_parsed = true;
                }

                non_commnets_processed = non_commnets_processed + 1;

            } else {
                // Extract the part after optional leading whitespace and before an optional space and label
                std::regex_search(buffer, trimmed, std::regex("([ \t]*)([^ \t]*)(.*)"));
                std::string entry = trimmed[2];
                if (non_commnets_processed == 0) {
                    // First non-comment is the description. Can be ignored
                    non_commnets_processed = non_commnets_processed + 1;
                    description_parsed = true;
                    continue;
                }
                else if (non_commnets_processed == 1){
                    // Second non-comment line containers the number of entries.
                    entries  = std::stoul(entry);
                    non_commnets_processed = non_commnets_processed + 1;
                    continue;
                }
                else if (std::regex_match (entry, std::regex(".*[.]+.*") )) {
                    // Cent values *must* have a period. It's the law.
                    double cents = std::stod(entry);
                    scala_scale.add_degree(*new degree(cents));
                }
                else if (std::regex_match (entry, std::regex(".*[/]{1}.*") )) {
                    // A ratio
                    std::regex_search(entry, match, std::regex("(.*)/(.*)"));
                    numerator = std::stoi(match.str(1)); 
                    denominator = std::stoi(match.str(2)); 
                    scala_scale.add_degree(*new degree(numerator, denominator));
                } else if (std::regex_match (entry, std::regex("[0-9]*") )) {
                    // According to the standard, single numbers should be treated as ratios
                    numerator = std::stoi(entry); 
                    denominator = 1;
                    scala_scale.add_degree(*new degree(numerator, denominator));
                }
#ifdef SCALA_STRICT
                else {
                    // In strict mode we'll make sure to throw an error if the line
                    // can't be interpreted.  In lax mode we just give up and move on.
                    std::string message = "Scala parse error: cannot interpret: ";
                    throw std::runtime_error(message.append(buffer));
                }
#endif
            }
        }
        
#ifdef SCALA_STRICT
        if (scala_scale.get_scale_length() != entries + 1){
            // If we make is here one of the entries probably didn't parse, but it wasn't
            // such that an error was thrown.  Strict adherence says you should throw an 
            // error on all file parse errors.
            throw std::runtime_error("Scala file parse error: Unexpected number of entries");
        }
#endif
        
        return scala_scale;
    }